

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringiterator_p.h
# Opt level: O2

char32_t __thiscall QStringIterator::next(QStringIterator *this,char32_t invalidAs)

{
  const_iterator pQVar1;
  char16_t cVar2;
  char16_t cVar3;
  const_iterator pQVar4;
  char32_t cVar5;
  
  pQVar4 = this->pos;
  pQVar1 = pQVar4 + 1;
  this->pos = pQVar1;
  cVar2 = pQVar4->ucs;
  cVar5 = (char32_t)(ushort)cVar2;
  if (((((cVar2 & 0xf800U) == 0xd800) && (cVar5 = invalidAs, (cVar2 & 0xdc00U) == 0xd800)) &&
      (pQVar1 < this->e)) && (cVar3 = pQVar1->ucs, (cVar3 & 0xfc00U) == 0xdc00)) {
    this->pos = pQVar4 + 2;
    return (uint)(ushort)cVar2 * 0x400 + (uint)(ushort)cVar3 + L'\xfca02400';
  }
  return cVar5;
}

Assistant:

inline char32_t next(char32_t invalidAs = QChar::ReplacementCharacter)
    {
        Q_ASSERT_X(hasNext(), Q_FUNC_INFO, "iterator hasn't a next item");

        const QChar uc = *pos++;
        if (Q_UNLIKELY(uc.isSurrogate())) {
            if (Q_LIKELY(uc.isHighSurrogate() && hasNext() && pos->isLowSurrogate()))
                return QChar::surrogateToUcs4(uc, *pos++);
            return invalidAs;
        }

        return uc.unicode();
    }